

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O3

SUNErrCode SUNMatSpace_Band(SUNMatrix A,long *lenrw,long *leniw)

{
  void *pvVar1;
  
  pvVar1 = A->content;
  *lenrw = (*(long *)((long)pvVar1 + 0x20) + *(long *)((long)pvVar1 + 0x28) + 1) *
           *(long *)((long)pvVar1 + 8);
  *leniw = *(long *)((long)pvVar1 + 8) + 7;
  return 0;
}

Assistant:

SUNErrCode SUNMatSpace_Band(SUNMatrix A, long int* lenrw, long int* leniw)
{
  SUNFunctionBegin(A->sunctx);
  SUNAssert(SUNMatGetID(A) == SUNMATRIX_BAND, SUN_ERR_ARG_WRONGTYPE);
  SUNAssert(lenrw, SUN_ERR_ARG_CORRUPT);
  SUNAssert(leniw, SUN_ERR_ARG_CORRUPT);
  *lenrw = SM_COLUMNS_B(A) * (SM_SUBAND_B(A) + SM_LBAND_B(A) + 1);
  *leniw = 7 + SM_COLUMNS_B(A);
  return SUN_SUCCESS;
}